

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall Assimp::FBX::FBXConverter::ConvertVideo(FBXConverter *this,Video *video)

{
  aiTexel *paVar1;
  size_type sVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  bool bVar5;
  aiTexture *paVar6;
  aiTexture *out_tex;
  string ext;
  
  paVar6 = (aiTexture *)operator_new(0x428);
  paVar6->mWidth = 0;
  paVar6->mHeight = 0;
  paVar6->pcData = (aiTexel *)0x0;
  (paVar6->mFilename).length = 0;
  (paVar6->mFilename).data[0] = '\0';
  memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
  paVar6->achFormatHint[0] = '\0';
  paVar6->achFormatHint[1] = '\0';
  paVar6->achFormatHint[2] = '\0';
  paVar6->achFormatHint[3] = '\0';
  out_tex = paVar6;
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back(&this->textures,&out_tex);
  out_tex->mWidth = (uint)video->contentLength;
  out_tex->mHeight = 0;
  paVar1 = (aiTexel *)video->content;
  video->content = (uint8_t *)0x0;
  out_tex->pcData = paVar1;
  sVar2 = (video->relativeFileName)._M_string_length;
  BaseImporter::GetExtension(&ext,&video->relativeFileName + (sVar2 == 0));
  bVar5 = std::operator==(&ext,"jpeg");
  if (bVar5) {
    std::__cxx11::string::assign((char *)&ext);
  }
  paVar6 = out_tex;
  if (ext._M_string_length < 4) {
    memcpy(out_tex->achFormatHint,ext._M_dataplus._M_p,ext._M_string_length);
  }
  aiString::Set(&paVar6->mFilename,(&video->relativeFileName)[sVar2 == 0]._M_dataplus._M_p);
  ppaVar3 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar4 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::~string((string *)&ext);
  return (int)((ulong)((long)ppaVar3 - (long)ppaVar4) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertVideo(const Video& video)
        {
            // generate empty output texture
            aiTexture* out_tex = new aiTexture();
            textures.push_back(out_tex);

            // assuming the texture is compressed
            out_tex->mWidth = static_cast<unsigned int>(video.ContentLength()); // total data size
            out_tex->mHeight = 0; // fixed to 0

            // steal the data from the Video to avoid an additional copy
            out_tex->pcData = reinterpret_cast<aiTexel*>(const_cast<Video&>(video).RelinquishContent());

            // try to extract a hint from the file extension
            const std::string& filename = video.RelativeFilename().empty() ? video.FileName() : video.RelativeFilename();
            std::string ext = BaseImporter::GetExtension(filename);

            if (ext == "jpeg") {
                ext = "jpg";
            }

            if (ext.size() <= 3) {
                memcpy(out_tex->achFormatHint, ext.c_str(), ext.size());
            }

            out_tex->mFilename.Set(filename.c_str());

            return static_cast<unsigned int>(textures.size() - 1);
        }